

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintTwoTuples.h
# Opt level: O1

void __thiscall
chrono::
ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
::Build_CqT(ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
            *this,ChSparseMatrix *storage,int inscol)

{
  int iVar1;
  ChVariables *pCVar2;
  int i;
  long lVar3;
  
  pCVar2 = (this->tuple_a).variables;
  if (pCVar2->disabled == false) {
    iVar1 = pCVar2->offset;
    lVar3 = 0;
    do {
      (**storage->_vptr_SparseMatrix)
                ((this->tuple_a).Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.
                 m_storage.m_data.array[lVar3],storage,(ulong)(uint)(iVar1 + (int)lVar3),
                 (ulong)(uint)inscol,1);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 6);
  }
  pCVar2 = (this->tuple_b).variables;
  if (pCVar2->disabled == false) {
    iVar1 = pCVar2->offset;
    lVar3 = 0;
    do {
      (**storage->_vptr_SparseMatrix)
                ((this->tuple_b).Cq.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.
                 m_storage.m_data.array[lVar3],storage,(ulong)(uint)(iVar1 + (int)lVar3),
                 (ulong)(uint)inscol,1);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 6);
  }
  return;
}

Assistant:

virtual void Build_CqT(ChSparseMatrix& storage, int inscol) override {
        tuple_a.Build_CqT(storage, inscol);
        tuple_b.Build_CqT(storage, inscol);
    }